

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_set_time(spng_ctx *ctx,spng_time *time)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((((time != (spng_time *)0x0 && ctx != (spng_ctx *)0x0) &&
       ((((ctx->data != (uchar *)0x0 || (iVar2 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
         (iVar2 = read_chunks(ctx,0), iVar2 == 0)) &&
        ((iVar2 = 0x3b, 0xf3 < (byte)(time->month - 0xd) && (0xe0 < (byte)(time->day - 0x20)))))))
      && (time->hour < 0x18)) && ((time->minute < 0x3c && (time->second < 0x3d)))) {
    ctx->time = *time;
    uVar1._0_4_ = ctx->user;
    uVar1._4_4_ = ctx->stored;
    ctx->user = (spng_chunk_bitfield)(int)(uVar1 | 0x200000002000);
    ctx->stored = (spng_chunk_bitfield)(int)((uVar1 | 0x200000002000) >> 0x20);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int spng_set_time(spng_ctx *ctx, struct spng_time *time)
{
    SPNG_SET_CHUNK_BOILERPLATE(time);

    if(check_time(time)) return SPNG_ETIME;

    ctx->time = *time;

    ctx->stored.time = 1;
    ctx->user.time = 1;

    return 0;
}